

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

ParsedRfcDateTime rfcDateImpl(QStringView s)

{
  storage_type_conflict sVar1;
  uint uVar2;
  undefined8 pos;
  anon_class_1_0_00000001 *paVar3;
  storage_type_conflict *psVar4;
  int iVar5;
  int m;
  storage_type_conflict *extraout_RDX;
  storage_type_conflict *extraout_RDX_00;
  storage_type_conflict *extraout_RDX_01;
  storage_type_conflict *extraout_RDX_02;
  storage_type_conflict *psVar6;
  storage_type_conflict *extraout_RDX_03;
  QDate QVar7;
  int iVar8;
  int iVar9;
  anon_class_1_0_00000001 *paVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  storage_type_conflict *psVar14;
  QStringView *pQVar15;
  long in_FS_OFFSET;
  bool bVar16;
  QStringView name;
  QStringView name_00;
  ParsedRfcDateTime PVar17;
  QStringView monthName;
  char *local_180;
  int local_178;
  ulong local_170;
  QDate local_168;
  bool ok;
  iterator it;
  QStringView local_120;
  QStringView local_110;
  QStringTokenizerBase<QStringView,_QChar> local_100;
  undefined1 local_e0 [24];
  QStringView local_c8;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  QStringView local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined4 local_40;
  long local_38;
  
  local_100.m_haystack.m_data = s.m_data;
  local_100.m_haystack.m_size = s.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_e0._16_8_ = &local_c8;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_c8.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  local_e0._0_8_ = 6;
  local_e0._8_8_ = 0;
  local_100.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>
  .super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x1;
  local_100.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
  local_100.m_needle.ucs = L' ';
  local_100._26_6_ = 0xaaaaaaaaaaaa;
  it.current.state.extra = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  it.current.state.start = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  it.current.state.end = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  it.current.value.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  it.current._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  it.tokenizer = (QStringTokenizerBase<QStringView,_QChar> *)&DAT_aaaaaaaaaaaaaaaa;
  it.current.value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QStringTokenizerBase<QStringView,_QChar>::iterator::iterator(&it,&local_100);
  iVar8 = 6;
  while( true ) {
    pos = local_e0._16_8_;
    bVar16 = iVar8 == 0;
    iVar8 = iVar8 + -1;
    if ((bVar16) || (it.current.ok == false)) break;
    QVarLengthArray<QStringView,6ll>::emplace_back<QStringView_const&>
              ((QVarLengthArray<QStringView,6ll> *)local_e0,&it.current.value);
    QStringTokenizerBase<QStringView,_QChar>::iterator::advance(&it);
  }
  QVar7.jd = 0x8000000000000000;
  local_170 = 0xffffffff;
  if (((long)local_e0._8_8_ < 3) || (it.current.ok != false)) {
    uVar13 = 0;
    goto LAB_0030ceb2;
  }
  local_170 = 0xffffffff;
  ok = true;
  local_168.jd = 0x8000000000000000;
  paVar10 = (anon_class_1_0_00000001 *)*(qsizetype *)local_e0._16_8_;
  psVar14 = *(storage_type_conflict **)(local_e0._16_8_ + 8);
  local_180 = (char *)0x2;
  if ((paVar10 == (anon_class_1_0_00000001 *)0x0) || (psVar14[(long)(paVar10 + -1)] != L',')) {
    bVar16 = QChar::isDigit((uint)(ushort)*psVar14);
    psVar6 = extraout_RDX_00;
    paVar3 = (anon_class_1_0_00000001 *)0x0;
    psVar4 = (storage_type_conflict *)0x0;
    if (bVar16) goto LAB_0030cbd2;
    QVLABase<QStringView>::erase((QVLABase<QStringView> *)local_e0,(const_iterator)pos);
    if (0xfffffffffffffffc < local_e0._8_8_ - 6) {
      iVar8 = 1;
      psVar6 = extraout_RDX_01;
      if (3 < (ulong)local_e0._8_8_) {
        bVar16 = QStringView::contains
                           ((QStringView *)(local_e0._16_8_ + 0x20),(QChar)0x3a,CaseSensitive);
        local_180 = (char *)((ulong)bVar16 | 2);
        psVar6 = extraout_RDX_02;
      }
      local_178 = 0;
      goto LAB_0030cc57;
    }
  }
  else {
    QVLABase<QStringView>::erase((QVLABase<QStringView> *)local_e0,(const_iterator)local_e0._16_8_);
    psVar6 = extraout_RDX;
    paVar3 = paVar10 + -1;
    psVar4 = psVar14;
LAB_0030cbd2:
    psVar14 = psVar4;
    paVar10 = paVar3;
    iVar8 = 0;
    if (0xfffffffffffffffc < local_e0._8_8_ - 6) {
      local_178 = 1;
LAB_0030cc57:
      if (paVar10 == (anon_class_1_0_00000001 *)0x0) {
        iVar9 = 0;
LAB_0030cd96:
        iVar8 = QStringView::toInt((QStringView *)
                                   ((long)(qsizetype *)local_e0._16_8_ + (ulong)(uint)(iVar8 << 4)),
                                   &ok,10);
        if ((ok != false) &&
           (iVar5 = QStringView::toInt((QStringView *)
                                       ((long)(qsizetype *)local_e0._16_8_ +
                                       (ulong)(uint)((int)local_180 << 4)),&ok,10), ok != false)) {
          paVar10 = *(anon_class_1_0_00000001 **)
                     ((long)(qsizetype *)local_e0._16_8_ + (ulong)(uint)(local_178 << 4));
          psVar14 = *(storage_type_conflict **)
                     ((long)(local_e0._16_8_ + 8) + (ulong)(uint)(local_178 << 4));
          name_00.m_data = extraout_RDX_03;
          name_00.m_size = (qsizetype)psVar14;
          bVar16 = rfcDateImpl::anon_class_1_0_00000001::operator()(paVar10,name_00);
          if (bVar16) {
            monthName.m_data = psVar14;
            monthName.m_size = (qsizetype)paVar10;
            m = fromShortMonthName(monthName);
            if (-1 < m) {
              QDate::QDate((QDate *)&local_68,iVar5,m,iVar8);
              QVar7.jd = local_68.m_size;
              local_168.jd = local_68.m_size;
              if ((iVar9 != 0) && (iVar8 = QDate::dayOfWeek(&local_168), iVar8 != iVar9)) {
                QVar7.jd = 0x8000000000000000;
              }
            }
            goto LAB_0030ccf8;
          }
        }
      }
      else {
        name.m_data = psVar6;
        name.m_size = (qsizetype)psVar14;
        bVar16 = rfcDateImpl::anon_class_1_0_00000001::operator()(paVar10,name);
        if (bVar16) {
          pQVar15 = &local_68;
          local_68.m_size = 0x54006e006f004d;
          local_68.m_data = (storage_type_conflict *)0x65005700650075;
          local_58 = 0x75006800540064;
          uStack_50 = 0x53006900720046;
          local_48 = 0x75005300740061;
          local_40 = 0x6e;
          local_110.m_size = (qsizetype)paVar10;
          local_110.m_data = psVar14;
          for (lVar11 = -7; lVar11 != 0; lVar11 = lVar11 + 1) {
            local_120.m_size = 3;
            local_120.m_data = (storage_type_conflict *)pQVar15;
            bVar16 = comparesEqual(&local_110,&local_120);
            if (bVar16) {
              iVar9 = (int)lVar11 + 8;
              goto LAB_0030cd96;
            }
            pQVar15 = (QStringView *)((long)&pQVar15->m_size + 6);
          }
          QVar7.jd = 0x8000000000000000;
LAB_0030ccf8:
          QVLABase<QStringView>::remove((QVLABase<QStringView> *)local_e0,local_180);
          QVLABase<QStringView>::remove((QVLABase<QStringView> *)local_e0,(char *)0x0);
          if (local_e0._8_8_ == 0) {
            uVar12 = 0xffffffffffffffff;
LAB_0030cef1:
            uVar13 = 0;
LAB_0030cef4:
            local_170 = uVar12 & 0xffffffff;
            goto LAB_0030ceb2;
          }
          bVar16 = QStringView::contains((QStringView *)local_e0._16_8_,(QChar)0x3a,CaseSensitive);
          if (bVar16) {
            lVar11 = *(qsizetype *)local_e0._16_8_;
            psVar14 = *(storage_type_conflict **)(local_e0._16_8_ + 8);
            QVLABase<QStringView>::erase
                      ((QVLABase<QStringView> *)local_e0,(const_iterator)local_e0._16_8_);
            if ((4 < lVar11) && (psVar14[2] == L':')) {
              if (lVar11 == 8) {
                if (psVar14[5] == L':') {
LAB_0030cfbc:
                  local_68.m_size = 2;
                  local_68.m_data = psVar14;
                  iVar8 = QStringView::toInt(&local_68,&ok,10);
                  if (ok != false) {
                    local_68.m_data = psVar14 + 3;
                    local_68.m_size = 2;
                    iVar9 = QStringView::toInt(&local_68,&ok,10);
                    iVar5 = 0;
                    if (ok != false) {
                      if (lVar11 == 8) {
                        local_68.m_data = psVar14 + 6;
                        local_68.m_size = 2;
                        iVar5 = QStringView::toInt(&local_68,&ok,10);
                      }
                      if ((ok & 1U) != 0) {
                        QTime::QTime((QTime *)&local_68,iVar8,iVar9,iVar5,0);
                        uVar12 = local_68.m_size & 0xffffffff;
                        goto LAB_0030ce76;
                      }
                    }
                  }
                }
              }
              else if (lVar11 == 5) goto LAB_0030cfbc;
            }
          }
          else {
            uVar12 = 0xffffffffffffffff;
LAB_0030ce76:
            if (local_e0._8_8_ == 0) goto LAB_0030cef1;
            lVar11 = *(qsizetype *)local_e0._16_8_;
            psVar14 = *(storage_type_conflict **)(local_e0._16_8_ + 8);
            QVLABase<QStringView>::erase
                      ((QVLABase<QStringView> *)local_e0,(const_iterator)local_e0._16_8_);
            if (((local_e0._8_8_ == 0) && ((lVar11 == 3 || (lVar11 == 5)))) &&
               ((sVar1 = *psVar14, sVar1 == L'-' || (sVar1 == L'+')))) {
              local_68.m_data = psVar14 + 1;
              local_68.m_size = 2;
              iVar8 = QStringView::toInt(&local_68,&ok,10);
              iVar9 = 0;
              if (ok != false) {
                if (lVar11 == 5) {
                  local_68.m_data = psVar14 + 3;
                  local_68.m_size = 2;
                  iVar9 = QStringView::toInt(&local_68,&ok,10);
                }
                if ((ok & 1U) != 0) {
                  iVar9 = iVar9 + iVar8 * 0x3c;
                  uVar2 = iVar9 * -0x3c;
                  if (sVar1 != L'-') {
                    uVar2 = iVar9 * 0x3c;
                  }
                  uVar13 = (ulong)uVar2 << 0x20;
                  goto LAB_0030cef4;
                }
              }
            }
          }
        }
      }
    }
  }
  uVar13 = 0;
  QVar7.jd = -0x8000000000000000;
LAB_0030ceb2:
  QVarLengthArray<QStringView,_6LL>::~QVarLengthArray((QVarLengthArray<QStringView,_6LL> *)local_e0)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  PVar17.time.mds = (int)(uVar13 | local_170);
  PVar17.utcOffset = (int)((uVar13 | local_170) >> 0x20);
  PVar17.date.jd = QVar7.jd;
  return PVar17;
}

Assistant:

static ParsedRfcDateTime rfcDateImpl(QStringView s)
{
    // Matches "[ddd,] dd MMM yyyy[ hh:mm[:ss]] [±hhmm]" - correct RFC 822, 2822, 5322 format -
    // or           "ddd MMM dd[ hh:mm:ss] yyyy [±hhmm]" - permissive RFC 850, 1036 (read only)
    ParsedRfcDateTime result;

    QVarLengthArray<QStringView, 6> words;

    auto tokens = s.tokenize(u' ', Qt::SkipEmptyParts);
    auto it = tokens.begin();
    for (int i = 0; i < 6 && it != tokens.end(); ++i, ++it)
        words.emplace_back(*it);

    if (words.size() < 3 || it != tokens.end())
        return result;
    const QChar colon(u':');
    bool ok = true;
    QDate date;

    const auto isShortName = [](QStringView name) {
        return (name.size() == 3 && name[0].isUpper()
                && name[1].isLower() && name[2].isLower());
    };

    /* Reject entirely (return) if the string is malformed; however, if the date
     * is merely invalid, (break, so as to) go on to parsing of the time.
     */
    int yearIndex;
    do { // "loop" so that we can use break on merely invalid, but "right shape" date.
        QStringView dayName;
        bool rfcX22 = true;
        const QStringView maybeDayName = words.front();
        if (maybeDayName.endsWith(u',')) {
            dayName = maybeDayName.chopped(1);
            words.erase(words.begin());
        } else if (!maybeDayName.front().isDigit()) {
            dayName = maybeDayName;
            words.erase(words.begin());
            rfcX22 = false;
        } // else: dayName is not specified (so we can only be RFC *22)
        if (words.size() < 3 || words.size() > 5)
            return result;

        // Don't break before setting yearIndex.
        int dayIndex, monthIndex;
        if (rfcX22) {
            // dd MMM yyyy [hh:mm[:ss]] [±hhmm]
            dayIndex = 0;
            monthIndex = 1;
            yearIndex = 2;
        } else {
            // MMM dd[ hh:mm:ss] yyyy [±hhmm]
            dayIndex = 1;
            monthIndex = 0;
            yearIndex = words.size() > 3 && words.at(2).contains(colon) ? 3 : 2;
        }

        int dayOfWeek = 0;
        if (!dayName.isEmpty()) {
            if (!isShortName(dayName))
                return result;
            dayOfWeek = shortDayFromName(dayName);
            if (!dayOfWeek)
                break;
        }

        const int day = words.at(dayIndex).toInt(&ok);
        if (!ok)
            return result;
        const int year = words.at(yearIndex).toInt(&ok);
        if (!ok)
            return result;
        const QStringView monthName = words.at(monthIndex);
        if (!isShortName(monthName))
            return result;
        int month = fromShortMonthName(monthName);
        if (month < 0)
            break;

        date = QDate(year, month, day);
        if (dayOfWeek && date.dayOfWeek() != dayOfWeek)
            date = QDate();
    } while (false);
    words.remove(yearIndex);
    words.remove(0, 2); // month and day-of-month, in some order

    // Time: [hh:mm[:ss]]
    QTime time;
    if (words.size() && words.at(0).contains(colon)) {
        const QStringView when = words.front();
        words.erase(words.begin());
        if (when.size() < 5 || when[2] != colon
            || (when.size() == 8 ? when[5] != colon : when.size() > 5)) {
            return result;
        }
        const int hour = when.first(2).toInt(&ok);
        if (!ok)
            return result;
        const int minute = when.sliced(3, 2).toInt(&ok);
        if (!ok)
            return result;
        const auto secs = when.size() == 8 ? when.last(2).toInt(&ok) : 0;
        if (!ok)
            return result;
        time = QTime(hour, minute, secs);
    }

    // Offset: [±hh[mm]]
    int offset = 0;
    if (words.size()) {
        const QStringView zone = words.front();
        words.erase(words.begin());
        if (words.size() || !(zone.size() == 3 || zone.size() == 5))
            return result;
        bool negate = false;
        if (zone[0] == u'-')
            negate = true;
        else if (zone[0] != u'+')
            return result;
        const int hour = zone.sliced(1, 2).toInt(&ok);
        if (!ok)
            return result;
        const auto minute = zone.size() == 5 ? zone.last(2).toInt(&ok) : 0;
        if (!ok)
            return result;
        offset = (hour * 60 + minute) * 60;
        if (negate)
            offset = -offset;
    }

    result.date = date;
    result.time = time;
    result.utcOffset = offset;
    return result;
}